

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

golf_entity_t *
golf_entity_geo(golf_entity_t *__return_storage_ptr__,char *name,golf_transform_t transform,
               golf_movement_t movement,golf_geo_t geo,golf_lightmap_section_t lightmap_section)

{
  golf_entity_t *entity;
  char *name_local;
  
  __return_storage_ptr__->active = true;
  __return_storage_ptr__->parent_idx = -1;
  __return_storage_ptr__->type = GEO_ENTITY;
  snprintf(__return_storage_ptr__->name,0x40,"%s",name);
  memcpy((void *)((long)&__return_storage_ptr__->field_4 + 0x60),&transform,0x28);
  memcpy((void *)((long)&__return_storage_ptr__->field_4 + 0x88),&movement,0x28);
  memcpy((void *)((long)&__return_storage_ptr__->field_4 + 0xb0),&geo,0xe8);
  memcpy(&__return_storage_ptr__->field_4,&lightmap_section,0x60);
  return __return_storage_ptr__;
}

Assistant:

golf_entity_t golf_entity_geo(const char *name, golf_transform_t transform, golf_movement_t movement, golf_geo_t geo, golf_lightmap_section_t lightmap_section) {
    golf_entity_t entity;
    entity.active = true;
    entity.parent_idx = -1;
    entity.type = GEO_ENTITY;
    snprintf(entity.name, GOLF_MAX_NAME_LEN, "%s", name);
    entity.geo.transform = transform;
    entity.geo.movement = movement;
    entity.geo.geo = geo;
    entity.geo.lightmap_section = lightmap_section;
    return entity;
}